

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkImageUtil.cpp
# Opt level: O0

CompareMode vk::mapVkSamplerCompareOp(VkCompareOp compareOp)

{
  CompareMode local_c;
  VkCompareOp compareOp_local;
  
  switch(compareOp) {
  case VK_COMPARE_OP_NEVER:
    local_c = COMPAREMODE_NEVER;
    break;
  case VK_COMPARE_OP_LESS:
    local_c = COMPAREMODE_LESS;
    break;
  case VK_COMPARE_OP_EQUAL:
    local_c = COMPAREMODE_EQUAL;
    break;
  case VK_COMPARE_OP_LESS_OR_EQUAL:
    local_c = COMPAREMODE_LESS_OR_EQUAL;
    break;
  case VK_COMPARE_OP_GREATER:
    local_c = COMPAREMODE_GREATER;
    break;
  case VK_COMPARE_OP_NOT_EQUAL:
    local_c = COMPAREMODE_NOT_EQUAL;
    break;
  case VK_COMPARE_OP_GREATER_OR_EQUAL:
    local_c = COMPAREMODE_GREATER_OR_EQUAL;
    break;
  case VK_COMPARE_OP_ALWAYS:
    local_c = COMPAREMODE_ALWAYS;
    break;
  default:
    local_c = COMPAREMODE_LAST;
  }
  return local_c;
}

Assistant:

tcu::Sampler::CompareMode mapVkSamplerCompareOp (VkCompareOp compareOp)
{
	switch (compareOp)
	{
		case VK_COMPARE_OP_NEVER:				return tcu::Sampler::COMPAREMODE_NEVER;
		case VK_COMPARE_OP_LESS:				return tcu::Sampler::COMPAREMODE_LESS;
		case VK_COMPARE_OP_EQUAL:				return tcu::Sampler::COMPAREMODE_EQUAL;
		case VK_COMPARE_OP_LESS_OR_EQUAL:		return tcu::Sampler::COMPAREMODE_LESS_OR_EQUAL;
		case VK_COMPARE_OP_GREATER:				return tcu::Sampler::COMPAREMODE_GREATER;
		case VK_COMPARE_OP_NOT_EQUAL:			return tcu::Sampler::COMPAREMODE_NOT_EQUAL;
		case VK_COMPARE_OP_GREATER_OR_EQUAL:	return tcu::Sampler::COMPAREMODE_GREATER_OR_EQUAL;
		case VK_COMPARE_OP_ALWAYS:				return tcu::Sampler::COMPAREMODE_ALWAYS;
		default:
			break;
	}

	DE_ASSERT(false);
	return tcu::Sampler::COMPAREMODE_LAST;
}